

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clSetKernelArgSVMPointer(cl_kernel kernel,cl_uint arg_index,void *arg_value)

{
  time_point tickStart;
  bool bVar1;
  CLIntercept *this;
  cl_icd_dispatch *pcVar2;
  uint64_t enqueueCounter_00;
  SConfig *pSVar3;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDX;
  cl_uint in_ESI;
  cl_kernel in_RDI;
  cl_int retVal;
  time_point cpuEnd;
  time_point cpuStart;
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  CLIntercept *in_stack_00000110;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 uVar4;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffef0;
  CLIntercept *in_stack_fffffffffffffef8;
  int local_dc;
  char *local_d8;
  cl_event *local_d0;
  allocator local_c1;
  string local_c0 [32];
  time_point in_stack_ffffffffffffff60;
  cl_event *in_stack_ffffffffffffff68;
  cl_uint in_stack_ffffffffffffff74;
  cl_kernel in_stack_ffffffffffffff78;
  CLIntercept *in_stack_ffffffffffffff80;
  string local_78 [7];
  undefined1 in_stack_ffffffffffffff8f;
  string *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  CLIntercept *in_stack_ffffffffffffffa0;
  time_point in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  time_point in_stack_ffffffffffffffb8;
  time_point in_stack_ffffffffffffffc0;
  cl_event *local_38;
  cl_int local_4;
  
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  this = GetIntercept();
  if ((this == (CLIntercept *)0x0) ||
     (pcVar2 = CLIntercept::dispatch(this),
     pcVar2->clSetKernelArgSVMPointer == (cl_api_clSetKernelArgSVMPointer)0x0)) {
    local_dc = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_dc);
    local_4 = -0x30;
  }
  else {
    enqueueCounter_00 = CLIntercept::getEnqueueCounter(in_stack_fffffffffffffef8);
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->CallLogging & 1U) != 0) {
      in_stack_fffffffffffffef0 = in_RDX;
      CLIntercept::callLoggingEnter
                (this,"clSetKernelArgSVMPointer",enqueueCounter_00,in_RDI,
                 "kernel = %p, index = %u, value = %p",in_RDI,CONCAT44(uVar4,in_ESI));
    }
    pSVar3 = CLIntercept::config(this);
    if (((((pSVar3->DumpBuffersBeforeEnqueue & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(this), (pSVar3->DumpBuffersAfterEnqueue & 1U) != 0)) ||
        (pSVar3 = CLIntercept::config(this), (pSVar3->InjectBuffers & 1U) != 0)) ||
       ((pSVar3 = CLIntercept::config(this), (pSVar3->InjectImages & 1U) != 0 ||
        (pSVar3 = CLIntercept::config(this), (pSVar3->CaptureReplay & 1U) != 0)))) {
      CLIntercept::setKernelArgSVMPointer
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                 in_stack_ffffffffffffff68);
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffef0);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffef0);
    pSVar3 = CLIntercept::config(this);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffffb8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_38 = (cl_event *)in_stack_ffffffffffffffb8.__d.__r;
    }
    pcVar2 = CLIntercept::dispatch(this);
    local_4 = (*pcVar2->clSetKernelArgSVMPointer)(in_RDI,in_ESI,in_RDX);
    pSVar3 = CLIntercept::config(this);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffffa8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffffc0.__d.__r = in_stack_ffffffffffffffa8.__d.__r;
      pSVar3 = CLIntercept::config(this);
      if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
         (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,enqueueCounter_00),
         bVar1)) {
        std::allocator<char>::allocator();
        in_stack_ffffffffffffff60.__d.__r = in_stack_ffffffffffffffc0.__d.__r;
        std::__cxx11::string::string(local_78,"",(allocator *)&stack0xffffffffffffff87);
        in_stack_ffffffffffffff68 = local_38;
        in_stack_ffffffffffffffc0.__d.__r = in_stack_ffffffffffffff60.__d.__r;
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)CONCAT44(local_4,in_stack_ffffffffffffffb0),
                   (char *)in_stack_ffffffffffffffa8.__d.__r,(string *)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff60,in_stack_ffffffffffffffb8);
        std::__cxx11::string::~string(local_78);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
      }
    }
    pSVar3 = CLIntercept::config(this);
    if (((((pSVar3->ErrorLogging & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(this), (pSVar3->ErrorAssert & 1U) != 0)) ||
        (pSVar3 = CLIntercept::config(this), (pSVar3->NoErrors & 1U) != 0)) && (local_4 != 0)) {
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_stack_00000110,(char *)kernel,arg_index);
      }
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->NoErrors & 1U) != 0) {
        local_4 = 0;
      }
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,
                 (cl_sync_point_khr *)in_stack_ffffffffffffff60.__d.__r);
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->ChromeCallLogging & 1U) != 0) {
      std::allocator<char>::allocator();
      local_d8 = (char *)in_stack_ffffffffffffffc0.__d.__r;
      std::__cxx11::string::string(local_c0,"",&local_c1);
      local_d0 = local_38;
      tickStart.__d.__r._4_4_ = local_4;
      tickStart.__d.__r._0_4_ = in_stack_ffffffffffffffb0;
      CLIntercept::chromeCallLoggingExit
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 (bool)in_stack_ffffffffffffff8f,(uint64_t)in_stack_ffffffffffffff80,tickStart,
                 in_stack_ffffffffffffffa8);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clSetKernelArgSVMPointer) (
    cl_kernel kernel,
    cl_uint arg_index,
    const void* arg_value)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clSetKernelArgSVMPointer )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER_KERNEL(
            kernel,
            "kernel = %p, index = %u, value = %p",
            kernel,
            arg_index,
            arg_value );
        SET_KERNEL_ARG_SVM_POINTER( kernel, arg_index, arg_value );
        HOST_PERFORMANCE_TIMING_START();

        cl_int  retVal = pIntercept->dispatch().clSetKernelArgSVMPointer(
            kernel,
            arg_index,
            arg_value );

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( retVal );
        CALL_LOGGING_EXIT( retVal );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_KERNEL);
}